

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O3

HermiteSpline<5U,_2U> *
HermiteSpline<5U,_2U>::fit
          (HermiteSpline<5U,_2U> *__return_storage_ptr__,
          array<Eigen::Matrix<double,_2,__1,_0,_2,__1>,_3UL> *values)

{
  iterator __position;
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  undefined8 *puVar5;
  UnitBoundedPolynomial<5U,_2U> *pUVar6;
  UnitBoundedPolynomial<5U,_2U> *pUVar7;
  byte bVar8;
  Matrix<double,_2,_3,_1,_2,_3> B;
  double local_198 [6];
  Matrix<double,_2,_3,_0,_2,_3> local_168;
  Matrix<double,_2,_3,_0,_2,_3> local_138;
  UnitBoundedPolynomial<5U,_2U> local_100;
  UnitBoundedPolynomial<5U,_2U> local_98;
  
  bVar8 = 0;
  iVar3 = (int)values->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,_2,__1,_0,_2,__1>_>.
               m_storage.m_cols + -1;
  HermiteSpline(__return_storage_ptr__);
  if (-1 < iVar3) {
    lVar1 = -1;
    do {
      lVar4 = lVar1 + 1;
      lVar2 = 0;
      do {
        if (*(long *)((long)&values->_M_elems[0].
                             super_PlainObjectBase<Eigen::Matrix<double,_2,__1,_0,_2,__1>_>.
                             m_storage.m_cols + lVar2 * 2) <= lVar4) {
          __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                        "Eigen::Block<Eigen::Matrix<double, 2, -1>, 2, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, 2, -1>, BlockRows = 2, BlockCols = 1, InnerPanel = true]"
                       );
        }
        puVar5 = (undefined8 *)
                 (*(long *)((long)&values->_M_elems[0].
                                   super_PlainObjectBase<Eigen::Matrix<double,_2,__1,_0,_2,__1>_>.
                                   m_storage.m_data + lVar2 * 2) + lVar4 * 0x10);
        if (((ulong)puVar5 & 0xf) != 0) {
          __assert_fail("((internal::UIntPtr(block.data()) % (((int)1 >= (int)evaluator<XprType>::Alignment) ? (int)1 : (int)evaluator<XprType>::Alignment)) == 0) && \"data is not aligned\""
                        ,"/usr/include/eigen3/Eigen/src/Core/CoreEvaluators.h",0x4ca,
                        "Eigen::internal::block_evaluator<Eigen::Matrix<double, 2, -1>, 2, 1, true>::block_evaluator(const XprType &) [ArgType = Eigen::Matrix<double, 2, -1>, BlockRows = 2, BlockCols = 1, InnerPanel = true, HasDirectAccess = true]"
                       );
        }
        *(undefined8 *)((long)local_198 + lVar2) = *puVar5;
        *(undefined8 *)((long)local_198 + lVar2 + 0x18) = puVar5[1];
        lVar2 = lVar2 + 8;
      } while (lVar2 != 0x18);
      if (-1 < lVar1) {
        local_168.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
        array[1] = local_198[3];
        UnitBoundedPolynomial<5U,_2U>::fit(&local_98,&local_138,&local_168);
        pUVar6 = &local_98;
        pUVar7 = &local_100;
        for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
          pUVar7->_dims[0].coeffs[0] = pUVar6->_dims[0].coeffs[0];
          pUVar6 = (UnitBoundedPolynomial<5U,_2U> *)((long)pUVar6 + (ulong)bVar8 * -0x10 + 8);
          pUVar7 = (UnitBoundedPolynomial<5U,_2U> *)((long)pUVar7 + (ulong)bVar8 * -0x10 + 8);
        }
        __position._M_current =
             (__return_storage_ptr__->children).
             super__Vector_base<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->children).
            super__Vector_base<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<UnitBoundedPolynomial<5u,2u>,std::allocator<UnitBoundedPolynomial<5u,2u>>>::
          _M_realloc_insert<UnitBoundedPolynomial<5u,2u>const&>
                    ((vector<UnitBoundedPolynomial<5u,2u>,std::allocator<UnitBoundedPolynomial<5u,2u>>>
                      *)__return_storage_ptr__,__position,&local_100);
        }
        else {
          memmove(__position._M_current,&local_98,0x68);
          (__return_storage_ptr__->children).
          super__Vector_base<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        __return_storage_ptr__->length = local_100.length + __return_storage_ptr__->length;
      }
      lVar1 = lVar4;
    } while (lVar4 != iVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

HermiteSpline<Order, Dims> HermiteSpline<Order, Dims>::fit(array<MatrixNXd, Polynomial1::RequiredValues> values)
{
    const int N = values[0].cols()-1; // number of splines
    HermiteSpline<Order, Dims> result;

    Matrix<double, Dims, Polynomial1::RequiredValues, RowMajor> A;
    Matrix<double, Dims, Polynomial1::RequiredValues, RowMajor> B;

    for (int k = -1; k < N; ++k)
    {
        for (int j = 0; j < Polynomial1::RequiredValues; ++j)
        {
            B.col(j) = values[j].col(k+1);
        }

        if (k >= 0)
        {
            result.add(UnitBoundedPolynomial<Order, Dims>::fit(A, B));
        }

        A = B;
    }

    return result;
}